

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::anon_unknown_0::ParsingEndsInBuffer
          (anon_unknown_0 *this,char *ptr,char *end,int depth)

{
  anon_unknown_0 aVar1;
  int i;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  anon_unknown_0 *paVar6;
  pair<const_char_*,_int> pVar7;
  
  if (this < ptr) {
    uVar4 = (ulong)end & 0xffffffff;
    do {
      aVar1 = *this;
      uVar2 = (uint)(byte)aVar1;
      paVar6 = this + 1;
      if ((char)aVar1 < '\0') {
        uVar2 = ((uint)(byte)aVar1 + (uint)(byte)*paVar6 * 0x80) - 0x80;
        if ((char)*paVar6 < '\0') {
          paVar6 = this + 3;
          lVar5 = -0x15;
          while (uVar2 = ((byte)paVar6[-1] - 1 << ((char)lVar5 + 0x23U & 0x1f)) + uVar2,
                (char)paVar6[-1] < '\0') {
            paVar6 = paVar6 + 1;
            lVar5 = lVar5 + 7;
            if (lVar5 == 0) {
              return false;
            }
          }
        }
        else {
          paVar6 = this + 2;
        }
      }
      if (ptr < paVar6) break;
      if (uVar2 == 0) {
        return true;
      }
      iVar3 = (int)uVar4;
      switch(uVar2 & 7) {
      case 0:
        lVar5 = 0;
        do {
          lVar5 = lVar5 + 1;
        } while (lVar5 != 10);
        if ((char)*paVar6 < '\0') {
          paVar6 = paVar6 + 2;
          lVar5 = 9;
          while ((char)paVar6[-1] < '\0') {
            paVar6 = paVar6 + 1;
            lVar5 = lVar5 + -1;
            if (lVar5 == 0) {
              return false;
            }
          }
        }
        else {
          paVar6 = paVar6 + 1;
        }
        break;
      case 1:
        paVar6 = paVar6 + 8;
        break;
      case 2:
        uVar2 = (uint)(byte)*paVar6;
        if ((char)*paVar6 < '\0') {
          pVar7 = ReadSizeFallback((char *)paVar6,uVar2);
          uVar2 = pVar7.second;
          paVar6 = (anon_unknown_0 *)pVar7.first;
          if (paVar6 == (anon_unknown_0 *)0x0) goto switchD_00468c86_default;
        }
        else {
          paVar6 = paVar6 + 1;
        }
        if ((long)ptr - (long)paVar6 < (long)(int)uVar2) goto switchD_00468c86_default;
        paVar6 = paVar6 + (int)uVar2;
        break;
      case 3:
        uVar4 = (ulong)(iVar3 + 1);
        break;
      case 4:
        if (iVar3 < 1) {
          return true;
        }
        uVar4 = (ulong)(iVar3 - 1);
        break;
      case 5:
        paVar6 = paVar6 + 4;
        break;
      default:
        goto switchD_00468c86_default;
      }
      this = paVar6;
    } while (paVar6 < ptr);
switchD_00468c86_default:
  }
  return false;
}

Assistant:

bool ParsingEndsInBuffer(const char* ptr, const char* end, int depth) {
  while (ptr < end) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ptr == nullptr || ptr > end) return false;
    // ending on 0 tag is allowed and is the major reason for the necessity of
    // this function.
    if (tag == 0) return true;
    switch (tag & 7) {
      case 0: {  // Varint
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        if (ptr == nullptr) return false;
        break;
      }
      case 1: {  // fixed64
        ptr += 8;
        break;
      }
      case 2: {  // len delim
        int32_t size = ReadSize(&ptr);
        if (ptr == nullptr || size > end - ptr) return false;
        ptr += size;
        break;
      }
      case 3: {  // start group
        depth++;
        break;
      }
      case 4: {                    // end group
        if (--depth < 0) return true;  // We exit early
        break;
      }
      case 5: {  // fixed32
        ptr += 4;
        break;
      }
      default:
        return false;  // Unknown wireformat
    }
  }
  return false;
}